

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *handle;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  GLFWwindow *share_local;
  GLFWmonitor *monitor_local;
  char *title_local;
  int height_local;
  int width_local;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/glfw-3.2.1/src/window.c"
                  ,0x82,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    _height_local = (_GLFWwindow *)0x0;
  }
  else if ((width < 1) || (height < 1)) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,(ulong)(uint)height);
    _height_local = (_GLFWwindow *)0x0;
  }
  else {
    memcpy(&ctxconfig.share,&_glfw,0x48);
    memcpy(&wndconfig.maximized,&_glfw.hints.context,0x30);
    memcpy(&window,&_glfw.hints.window,0x30);
    window._0_4_ = width;
    window._4_4_ = height;
    wndconfig._0_8_ = title;
    ctxconfig._32_8_ = share;
    if ((share == (GLFWwindow *)0x0) ||
       ((wndconfig.maximized != 0 && (*(int *)(share + 0x1f0) != 0)))) {
      GVar1 = _glfwIsValidContextConfig((_GLFWctxconfig *)&wndconfig.maximized);
      if (GVar1 == 0) {
        _height_local = (_GLFWwindow *)0x0;
      }
      else {
        _height_local = (_GLFWwindow *)calloc(1,0x358);
        _height_local->next = _glfw.windowListHead;
        _glfw.windowListHead = _height_local;
        (_height_local->videoMode).width = width;
        (_height_local->videoMode).height = height;
        (_height_local->videoMode).redBits = (int)ctxconfig.share;
        (_height_local->videoMode).greenBits = ctxconfig.share._4_4_;
        (_height_local->videoMode).blueBits = fbconfig.redBits;
        (_height_local->videoMode).refreshRate = _glfw.hints.refreshRate;
        _height_local->monitor = (_GLFWmonitor *)monitor;
        _height_local->resizable = (GLFWbool)wndconfig.title;
        _height_local->decorated = wndconfig.resizable;
        _height_local->autoIconify = wndconfig.decorated;
        _height_local->floating = wndconfig.focused;
        _height_local->cursorMode = 0x34001;
        _height_local->minwidth = -1;
        _height_local->minheight = -1;
        _height_local->maxwidth = -1;
        _height_local->maxheight = -1;
        _height_local->numer = -1;
        _height_local->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if (wndconfig.maximized != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar2 = _glfwPlatformCreateWindow
                          (_height_local,(_GLFWwndconfig *)&window,
                           (_GLFWctxconfig *)&wndconfig.maximized,(_GLFWfbconfig *)&ctxconfig.share)
        ;
        if (iVar2 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
          glfwDestroyWindow((GLFWwindow *)_height_local);
          _height_local = (_GLFWwindow *)0x0;
        }
        else {
          if (wndconfig.maximized != 0) {
            (*(_height_local->context).makeCurrent)(_height_local);
            GVar1 = _glfwRefreshContextAttribs((_GLFWctxconfig *)&wndconfig.maximized);
            if (GVar1 == 0) {
              glfwMakeContextCurrent((GLFWwindow *)handle);
              glfwDestroyWindow((GLFWwindow *)_height_local);
              return (GLFWwindow *)0x0;
            }
            glfwMakeContextCurrent((GLFWwindow *)handle);
          }
          if (((_height_local->monitor == (_GLFWmonitor *)0x0) && (wndconfig.title._4_4_ != 0)) &&
             (_glfwPlatformShowWindow(_height_local), wndconfig.visible != 0)) {
            _glfwPlatformFocusWindow(_height_local);
          }
        }
      }
    }
    else {
      _glfwInputError(0x1000a,(char *)0x0);
      _height_local = (_GLFWwindow *)0x0;
    }
  }
  return (GLFWwindow *)_height_local;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}